

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

level_enum helics::getSpdLogLevel(int helicsLogLevel)

{
  level_enum lVar1;
  
  lVar1 = trace;
  if (helicsLogLevel != -10 && helicsLogLevel < 0x18) {
    if (0xe < helicsLogLevel) {
      return debug;
    }
    lVar1 = info;
    if (helicsLogLevel < 6) {
      if (2 < helicsLogLevel) {
        return warn;
      }
      if (helicsLogLevel != 2) {
        return (uint)~helicsLogLevel >> 0x1f ^ critical;
      }
    }
  }
  return lVar1;
}

Assistant:

static spdlog::level::level_enum getSpdLogLevel(int helicsLogLevel)
{
    if (helicsLogLevel >= LogLevels::TRACE || helicsLogLevel == LogLevels::DUMPLOG) {
        return spdlog::level::trace;
    }
    if (helicsLogLevel >= LogLevels::TIMING) {
        return spdlog::level::debug;
    }
    if (helicsLogLevel >= LogLevels::SUMMARY) {
        return spdlog::level::info;
    }
    if (helicsLogLevel >= LogLevels::WARNING) {
        return spdlog::level::warn;
    }
    if (helicsLogLevel == LogLevels::PROFILING) {
        return spdlog::level::info;
    }
    if (helicsLogLevel >= LogLevels::ERROR_LEVEL) {
        return spdlog::level::err;
    }
    return spdlog::level::critical;
}